

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O3

void am_check_start_obj_parameters
               (Am_Object *in_cmd,Am_Value_List *placeholder_list,
               Am_Value_List *created_objects_assoc,int *cnt)

{
  Am_Am_Slot_Key slot;
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  Am_Wrapper *value;
  uint value_00;
  Am_Object start_object;
  Am_Value v;
  Am_Value_List slots_modified;
  Am_Value_List slots_to_save;
  Am_Am_Slot_Key local_8a;
  Am_Object local_88;
  Am_Object *local_80;
  Am_Value local_78;
  Am_Value_List local_68;
  Am_Value_List local_58;
  Am_Value_List *local_48;
  Am_Value_List *local_40;
  int *local_38;
  
  local_80 = in_cmd;
  local_48 = placeholder_list;
  local_40 = created_objects_assoc;
  local_38 = cnt;
  pAVar2 = Am_Object::Get(in_cmd,0x11a,0);
  Am_Object::Am_Object(&local_88,pAVar2);
  bVar1 = Am_Object::Valid(&local_88);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&local_88,0xb8,0);
    Am_Value_List::Am_Value_List(&local_58,pAVar2);
    Am_Value_List::Am_Value_List(&local_68);
    local_78.type = 0;
    local_78.value.wrapper_value = (Am_Wrapper *)0x0;
    Am_Value_List::Start(&local_58);
    while( true ) {
      bVar1 = Am_Value_List::Last(&local_58);
      if (bVar1) break;
      pAVar2 = Am_Value_List::Get(&local_58);
      Am_Am_Slot_Key::Am_Am_Slot_Key(&local_8a,pAVar2);
      slot.value = local_8a.value;
      value_00 = (uint)local_8a.value;
      pAVar2 = Am_Object::Get(&local_88,local_8a.value,1);
      Am_Value::operator=(&local_78,pAVar2);
      bVar1 = Am_Value::Valid(&local_78);
      if (bVar1 && local_78.type == 0xa001) {
        if (am_sdebug == true) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"checking slot ",0xe);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," oldval ",8);
          poVar3 = operator<<(poVar3,&local_78);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          std::ostream::flush();
        }
        bVar1 = check_one_obj_modified(&local_78,slot.value,local_80,local_48,local_40,local_38);
        if (bVar1) {
          Am_Value_List::Add(&local_68,value_00,Am_TAIL,true);
        }
      }
      Am_Value_List::Next(&local_58);
    }
    bVar1 = Am_Value_List::Valid(&local_68);
    if (bVar1) {
      value = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_68);
      Am_Object::Set(local_80,0xb8,value,1);
    }
    Am_Value::~Am_Value(&local_78);
    Am_Value_List::~Am_Value_List(&local_68);
    Am_Value_List::~Am_Value_List(&local_58);
  }
  Am_Object::~Am_Object(&local_88);
  return;
}

Assistant:

void
am_check_start_obj_parameters(Am_Object &in_cmd,
                              Am_Value_List &placeholder_list,
                              Am_Value_List &created_objects_assoc, int &cnt)
{
  Am_Object start_object = in_cmd.Get(Am_START_OBJECT);
  if (start_object.Valid()) {
    Am_Value_List slots_to_save = start_object.Get(Am_SLOTS_TO_SAVE);
    Am_Value_List slots_modified;
    Am_Slot_Key slot;
    Am_Value v;
    for (slots_to_save.Start(); !slots_to_save.Last(); slots_to_save.Next()) {
      slot = (Am_Am_Slot_Key)slots_to_save.Get();
      v = start_object.Peek(slot);
      // **** should probably also check for lists of objects
      if (v.Valid() && v.type == Am_OBJECT) {
        if (am_sdebug)
          std::cout << "checking slot " << slot << " oldval " << v << std::endl
                    << std::flush;
        if (check_one_obj_modified(v, slot, in_cmd, placeholder_list,
                                   created_objects_assoc, cnt))
          slots_modified.Add(slot);
      }
    }
    if (slots_modified.Valid()) {
      in_cmd.Set(Am_SLOTS_TO_SAVE, slots_modified, Am_OK_IF_NOT_THERE);
    }
  }
}